

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balance.hpp
# Opt level: O0

void print_dynamic_assigner(Master *master,DynamicAssigner *dynamic_assigner)

{
  uint uVar1;
  int iVar2;
  Master *in_RSI;
  char (*in_stack_00000010) [18];
  FILE *in_stack_00000018;
  int *in_stack_00000020;
  int i;
  FILE *in_stack_00000038;
  int in_stack_ffffffffffffffcc;
  Master *in_stack_ffffffffffffffd0;
  uint local_14;
  
  fmt::v7::print<char[18],,char>(in_stack_00000018,in_stack_00000010);
  local_14 = 0;
  while( true ) {
    uVar1 = diy::Master::size((Master *)0x120dfe);
    if (uVar1 <= local_14) break;
    diy::Master::gid(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    in_stack_ffffffffffffffd0 = in_RSI;
    iVar2 = diy::Master::gid(in_RSI,in_stack_ffffffffffffffcc);
    (*(code *)(in_stack_ffffffffffffffd0->links_).
              super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
              super__Vector_impl_data._M_start[3])(in_stack_ffffffffffffffd0,iVar2);
    fmt::v7::print<char[24],int,int,char>
              (in_stack_00000038,(char (*) [24])master,(int *)dynamic_assigner,in_stack_00000020);
    local_14 = local_14 + 1;
  }
  fmt::v7::print<char[2],,char>(in_stack_00000018,(char (*) [2])in_stack_00000010);
  return;
}

Assistant:

void print_dynamic_assigner(const diy::Master&            master,
                            const diy::DynamicAssigner&   dynamic_assigner)
{
    fmt::print(stderr, "DynamicAssigner: ");
    for (auto i = 0; i < master.size(); i++)
        fmt::print(stderr, "[gid, proc] = [{}, {}] ", master.gid(i), dynamic_assigner.rank(master.gid(i)));
    fmt::print(stderr, "\n");
}